

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_bddPrintCover(DdManager *dd,DdNode *l,DdNode *u)

{
  int *piVar1;
  int iVar2;
  int *array;
  DdNode *pDVar3;
  DdNode *cube;
  long lVar4;
  int length;
  
  iVar2 = Cudd_ReadSize(dd);
  array = (int *)malloc((long)iVar2 << 2);
  if (array == (int *)0x0) {
LAB_006637a6:
    iVar2 = 0;
  }
  else {
    piVar1 = (int *)(((ulong)l & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    while (pDVar3 = Cudd_ReadLogicZero(dd), l != pDVar3) {
      pDVar3 = Cudd_LargestCube(dd,l,&length);
      if (pDVar3 == (DdNode *)0x0) {
LAB_00663799:
        Cudd_RecursiveDeref(dd,l);
        free(array);
        goto LAB_006637a6;
      }
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      cube = Cudd_bddMakePrime(dd,pDVar3,u);
      if (cube == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,l);
        l = pDVar3;
        goto LAB_00663799;
      }
      piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar3);
      pDVar3 = Cudd_bddAnd(dd,l,(DdNode *)((ulong)cube ^ 1));
      if (pDVar3 == (DdNode *)0x0) {
LAB_0066378e:
        Cudd_RecursiveDeref(dd,l);
        l = cube;
        goto LAB_00663799;
      }
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,l);
      iVar2 = Cudd_BddToCubeArray(dd,cube,array);
      l = pDVar3;
      if (iVar2 == 0) goto LAB_0066378e;
      for (lVar4 = 0; lVar4 < dd->size; lVar4 = lVar4 + 1) {
        iVar2 = 0x3f;
        if ((ulong)(uint)array[lVar4] < 3) {
          iVar2 = *(int *)(&DAT_00867294 + (ulong)(uint)array[lVar4] * 4);
        }
        fputc(iVar2,(FILE *)dd->out);
      }
      fwrite(" 1\n",3,1,(FILE *)dd->out);
      Cudd_RecursiveDeref(dd,cube);
    }
    fputc(10,(FILE *)dd->out);
    Cudd_RecursiveDeref(dd,l);
    free(array);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Cudd_bddPrintCover(
  DdManager *dd,
  DdNode *l,
  DdNode *u)
{
    int *array;
    int q, result;
    DdNode *lb;
#ifdef DD_DEBUG
    DdNode *cover;
#endif

    array = ABC_ALLOC(int, Cudd_ReadSize(dd));
    if (array == NULL) return(0);
    lb = l;
    cuddRef(lb);
#ifdef DD_DEBUG
    cover = Cudd_ReadLogicZero(dd);
    cuddRef(cover);
#endif
    while (lb != Cudd_ReadLogicZero(dd)) {
        DdNode *implicant, *prime, *tmp;
        int length;
        implicant = Cudd_LargestCube(dd,lb,&length);
        if (implicant == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,u);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,implicant);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,lb,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,lb);
        lb = tmp;
        result = Cudd_BddToCubeArray(dd,prime,array);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        for (q = 0; q < dd->size; q++) {
            switch (array[q]) {
            case 0:
                (void) fprintf(dd->out, "0");
                break;
            case 1:
                (void) fprintf(dd->out, "1");
                break;
            case 2:
                (void) fprintf(dd->out, "-");
                break;
            default:
                (void) fprintf(dd->out, "?");
            }
        }
        (void) fprintf(dd->out, " 1\n");
#ifdef DD_DEBUG
        tmp = Cudd_bddOr(dd,prime,cover);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,cover);
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cover);
        cover = tmp;
#endif
        Cudd_RecursiveDeref(dd,prime);
    }
    (void) fprintf(dd->out, "\n");
    Cudd_RecursiveDeref(dd,lb);
    ABC_FREE(array);
#ifdef DD_DEBUG
    if (!Cudd_bddLeq(dd,cover,u) || !Cudd_bddLeq(dd,l,cover)) {
        Cudd_RecursiveDeref(dd,cover);
        return(0);
    }
    Cudd_RecursiveDeref(dd,cover);
#endif
    return(1);

}